

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

int sys_parsedevlist(int *np,int *vecp,int max,char *str)

{
  long lVar1;
  char *local_38;
  char *endp;
  char *pcStack_28;
  int n;
  char *str_local;
  int *piStack_18;
  int max_local;
  int *vecp_local;
  int *np_local;
  
  endp._4_4_ = 0;
  pcStack_28 = str;
  str_local._4_4_ = max;
  piStack_18 = vecp;
  vecp_local = np;
  while ((endp._4_4_ < str_local._4_4_ && (*pcStack_28 != '\0'))) {
    lVar1 = strtol(pcStack_28,&local_38,10);
    piStack_18[endp._4_4_] = (int)lVar1;
    if ((local_38 == pcStack_28) || (endp._4_4_ = endp._4_4_ + 1, *local_38 == '\0')) break;
    pcStack_28 = local_38 + 1;
  }
  *vecp_local = endp._4_4_;
  return endp._4_4_;
}

Assistant:

static int sys_parsedevlist(int *np, int *vecp, int max, const char *str)
{
    int n = 0;
    while (n < max)
    {
        if (! *str) break;
        else
        {
            char *endp;
            vecp[n] = (int)strtol(str, &endp, 10);
            if (endp == str)
                break;
            n++;
            if (! *endp)
                break;
            str = endp + 1;
        }
    }
    return (*np = n);
}